

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall RealCommandRunner::WaitForCommand(RealCommandRunner *this,Result *result)

{
  Subprocess *pSVar1;
  ExitStatus EVar2;
  string *psVar3;
  pointer ppVar4;
  iterator local_38;
  iterator e;
  Subprocess *pSStack_28;
  bool interrupted;
  Subprocess *subproc;
  Result *result_local;
  RealCommandRunner *this_local;
  
  subproc = (Subprocess *)result;
  result_local = (Result *)this;
  do {
    pSStack_28 = SubprocessSet::NextFinished(&this->subprocs_);
    if (pSStack_28 != (Subprocess *)0x0) {
      EVar2 = Subprocess::Finish(pSStack_28);
      *(ExitStatus *)&(subproc->buf_)._M_string_length = EVar2;
      psVar3 = Subprocess::GetOutput_abi_cxx11_(pSStack_28);
      std::__cxx11::string::operator=
                ((string *)(subproc->buf_).field_2._M_local_buf,(string *)psVar3);
      local_38 = std::
                 map<const_Subprocess_*,_Edge_*,_std::less<const_Subprocess_*>,_std::allocator<std::pair<const_Subprocess_*const,_Edge_*>_>_>
                 ::find(&this->subproc_to_edge_,&stack0xffffffffffffffd8);
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_Subprocess_*const,_Edge_*>_>::operator->
                         (&local_38);
      *(Edge **)&subproc->buf_ = ppVar4->second;
      std::
      map<Subprocess_const*,Edge*,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
      ::erase_abi_cxx11_((map<Subprocess_const*,Edge*,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
                          *)&this->subproc_to_edge_,local_38);
      pSVar1 = pSStack_28;
      if (pSStack_28 != (Subprocess *)0x0) {
        Subprocess::~Subprocess(pSStack_28);
        operator_delete(pSVar1,0x30);
      }
      return true;
    }
    e._M_node._7_1_ = SubprocessSet::DoWork(&this->subprocs_);
  } while (!(bool)e._M_node._7_1_);
  return false;
}

Assistant:

bool RealCommandRunner::WaitForCommand(Result* result) {
  Subprocess* subproc;
  while ((subproc = subprocs_.NextFinished()) == NULL) {
    bool interrupted = subprocs_.DoWork();
    if (interrupted)
      return false;
  }

  result->status = subproc->Finish();
  result->output = subproc->GetOutput();

  map<const Subprocess*, Edge*>::iterator e = subproc_to_edge_.find(subproc);
  result->edge = e->second;
  subproc_to_edge_.erase(e);

  delete subproc;
  return true;
}